

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

char * GetSmbiosString(uint8_t index,void *base)

{
  size_t sVar1;
  char *local_28;
  char *strbase;
  void *base_local;
  char *pcStack_10;
  uint8_t index_local;
  
  if (index == '\0') {
    pcStack_10 = (char *)0x0;
  }
  else {
    local_28 = (char *)base;
    for (base_local._7_1_ = index + 0xff; base_local._7_1_ != '\0';
        base_local._7_1_ = base_local._7_1_ + -1) {
      sVar1 = strlen(local_28);
      local_28 = local_28 + sVar1 + 1;
    }
    pcStack_10 = local_28;
  }
  return pcStack_10;
}

Assistant:

const char *GetSmbiosString(uint8_t index, void *base)
{
    const char *strbase = (const char *)base;
    //printf("strbase=%s, index=%d\n", strbase, index);
    if (index == 0)
        return NULL;
    for (--index; index; --index) {
        strbase += strlen(strbase) + 1;
    }
    return strbase;
}